

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::PalRtCommand::PalRtCommand(PalRtCommand *this,int hx,int sx,int yl,int yh)

{
  int iVar1;
  uint8_t *puVar2;
  
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006ef860;
  puVar2 = drawerargs::dc_destorg;
  iVar1 = drawerargs::dc_pitch;
  (this->super_DrawerCommand)._dest_y =
       (int)((drawerargs::dc_dest - (long)drawerargs::dc_destorg) / (long)drawerargs::dc_pitch);
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006efe18;
  *(int *)&(this->super_DrawerCommand).field_0xc = hx;
  this->sx = sx;
  this->yl = yl;
  this->yh = yh;
  this->_destorg = puVar2;
  this->_pitch = iVar1;
  this->_colormap = drawerargs::dc_colormap;
  this->_srcblend = drawerargs::dc_srcblend;
  this->_destblend = drawerargs::dc_destblend;
  this->_translation = drawerargs::dc_translation;
  this->_color = drawerargs::dc_color;
  return;
}

Assistant:

PalRtCommand::PalRtCommand(int hx, int sx, int yl, int yh) : hx(hx), sx(sx), yl(yl), yh(yh)
	{
		using namespace drawerargs;
	
		_destorg = dc_destorg;
		_pitch = dc_pitch;
		_colormap = dc_colormap;
		_srcblend = dc_srcblend;
		_destblend = dc_destblend;
		_translation = dc_translation;
		_color = dc_color;
	}